

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * utilities::normalizePath(string *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  ulong uVar7;
  _Elt_pointer pbVar8;
  string dir;
  string sep;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  st;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  st1;
  string temp;
  value_type local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = std::__cxx11::string::find((char *)path,0x1204cc);
  pcVar6 = "/";
  if (lVar4 != -1) {
    pcVar6 = "\\";
  }
  std::__cxx11::string::string((string *)&local_130,pcVar6,(allocator *)&local_110);
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&local_110);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_130);
  uVar1 = path->_M_string_length;
  uVar7 = 0;
  while (uVar7 < uVar1) {
    local_150._M_string_length = 0;
    *local_150._M_dataplus._M_p = '\0';
    lVar4 = uVar7 - 1;
    do {
      uVar7 = uVar7 + 1;
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while ((path->_M_dataplus)._M_p[lVar2] == *local_130._M_dataplus._M_p);
    for (; (uVar7 - 1 < uVar1 &&
           ((path->_M_dataplus)._M_p[uVar7 - 1] != *local_130._M_dataplus._M_p)); uVar7 = uVar7 + 1)
    {
      std::__cxx11::string::push_back((char)&local_150);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_150);
    if (iVar3 == 0) {
      if (local_110.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_110.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&local_110.c);
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_150);
      if ((iVar3 != 0) && (local_150._M_string_length != 0)) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_110.c,&local_150);
      }
    }
  }
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&local_c0);
  while (local_110.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_110.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pbVar8 = local_110.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_110.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_110.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = local_110.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_c0.c,pbVar8 + -1);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&local_110.c);
  }
  while (local_c0.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_c0.c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pbVar8 = local_c0.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_c0.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_c0.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = local_c0.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)(pbVar8 + -1));
    sVar5 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_c0.c);
    if (sVar5 == 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      std::operator+(&local_70,&local_50,&local_130);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&local_c0.c);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_c0.c);
  std::__cxx11::string::~string((string *)&local_150);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_110.c);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string normalizePath(std::string &path)
    {
        std::string sep = (path.find("\\") != std::string::npos) ? "\\" : "/";

        std::stack<std::string> st;
        std::string dir;
        std::string res = sep;

        size_t len_path = path.length();

        for (size_t i = 0; i < len_path; i++)
        {
            dir.clear();
            while (path[i] == sep[0])
                i++;
            while (i < len_path && path[i] != sep[0]) {
                dir.push_back(path[i]);
                i++;
            }

            if (dir.compare("..") == 0)
            {
                if (!st.empty())
                    st.pop();
            }
            else if (dir.compare(".") == 0)
                continue;
            else if (dir.length() != 0)
                st.push(dir);
        }

        std::stack<std::string> st1;
        while (!st.empty())
        {
            st1.push(st.top());
            st.pop();
        }

        while (!st1.empty())
        {
            std::string temp = st1.top();
            
            if (st1.size() != 1)
            {
                res.append(temp + sep);
            }
            else
            {
                res.append(temp);
            }

            st1.pop();
        }

        return res;
    }